

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O1

StackFrame * __thiscall
cppassert::internal::StackTraceImpl::at(StackTraceImpl *this,size_t position)

{
  ostream *poVar1;
  out_of_range *this_00;
  stringstream msg;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (position < this->backtraceSize_ - 2) {
    return this->frames_ + position;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"StackFrame::at: Position ",0x19);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is out of range: 0 and ",0x18);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::out_of_range::out_of_range(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const StackTrace::StackFrame &at(std::size_t position) const
    {
        if(position<(backtraceSize_-cFramesToSkip))
        {
            return frames_[position];
        }
        std::stringstream msg;
        msg << "StackFrame::at: Position "<<position
            << " is out of range: 0 and "<<size();
        throw std::out_of_range(msg.str());
        //make compiler happy
        return frames_[0];
    }